

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * anon_unknown.dwarf_1a3010::CreateStore
                    (ExpressionContext *ctx,VmModule *module,SynBase *source,TypeBase *type,
                    VmValue *address,VmValue *value,uint offset)

{
  int iVar1;
  Allocator *allocator;
  VariableData *pVVar2;
  VmValue *pVVar3;
  undefined8 uVar4;
  TypeBase *pTVar5;
  TypeBase *pTVar6;
  bool bVar7;
  VmInstructionType VVar8;
  VmConstant *pVVar9;
  TypeRef *pTVar10;
  VmConstant *pVVar11;
  VmType type_00;
  VmType type_01;
  VmValue *in_stack_fffffffffffffeb8;
  SynBase *pSVar12;
  VmConstant *pointer_1;
  VmConstant *constant_1;
  VmConstant *pointer;
  VmConstant *constant;
  VmConstant *shiftAddress;
  VmConstant *constantAddress;
  VmValue *local_40;
  VmValue *value_local;
  VmValue *address_local;
  TypeBase *type_local;
  SynBase *source_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  local_40 = value;
  value_local = address;
  address_local = (VmValue *)type;
  type_local = (TypeBase *)source;
  source_local = (SynBase *)module;
  module_local = (VmModule *)ctx;
  _constantAddress = GetVmType(ctx,type);
  bVar7 = VmType::operator==(&value->type,(VmType *)&constantAddress);
  if (bVar7) {
    if ((address_local->comment).end == (char *)0x0) {
      ctx_local = (ExpressionContext *)CreateVoid((VmModule *)source_local);
    }
    else {
      pVVar9 = getType<VmConstant>(value_local);
      pTVar5 = type_local;
      if (pVVar9 == (VmConstant *)0x0) {
        pVVar9 = getType<VmConstant>(local_40);
        pTVar6 = type_local;
        pTVar5 = VmType::Void.structType;
        uVar4 = VmType::Void._0_8_;
        if ((pVVar9 == (VmConstant *)0x0) || ((pVVar9->isReference & 1U) == 0)) {
          pSVar12 = source_local;
          VVar8 = GetStoreInstruction((ExpressionContext *)module_local,(TypeBase *)address_local);
          pVVar3 = value_local;
          pVVar9 = CreateConstantInt((Allocator *)
                                     module_local[6].loadStoreInfo.little[0xf].loadPointer,
                                     (SynBase *)type_local,offset);
          type_01.structType._0_4_ = VVar8;
          type_01._0_8_ = pTVar5;
          type_01.structType._4_4_ = 0;
          ctx_local = (ExpressionContext *)
                      CreateInstruction((anon_unknown_dwarf_1a3010 *)pSVar12,(VmModule *)pTVar6,
                                        (SynBase *)uVar4,type_01,(VmInstructionType)pVVar3,
                                        &pVVar9->super_VmValue,local_40,(VmValue *)pSVar12);
        }
        else {
          pVVar3 = module_local[6].loadStoreInfo.little[0xf].loadPointer;
          iVar1 = pVVar9->iValue;
          pVVar2 = pVVar9->container;
          pTVar10 = ExpressionContext::GetReferenceType
                              ((ExpressionContext *)module_local,(TypeBase *)address_local);
          pVVar9 = CreateConstantPointer
                             ((Allocator *)pVVar3,(SynBase *)pTVar6,iVar1,pVVar2,
                              &pTVar10->super_TypeBase,true);
          ctx_local = (ExpressionContext *)
                      CreateMemCopy((VmModule *)source_local,(SynBase *)type_local,value_local,
                                    offset,&pVVar9->super_VmValue,0,
                                    (int)(address_local->comment).end);
        }
      }
      else {
        allocator = *(Allocator **)&source_local[0x56].listed;
        iVar1 = pVVar9->iValue;
        pVVar2 = pVVar9->container;
        pTVar10 = ExpressionContext::GetReferenceType
                            ((ExpressionContext *)module_local,(TypeBase *)address_local);
        pVVar9 = CreateConstantPointer
                           (allocator,(SynBase *)pTVar5,iVar1 + offset,pVVar2,
                            &pTVar10->super_TypeBase,true);
        pVVar11 = getType<VmConstant>(local_40);
        pSVar12 = source_local;
        pTVar6 = type_local;
        pTVar5 = VmType::Void.structType;
        uVar4 = VmType::Void._0_8_;
        if ((pVVar11 == (VmConstant *)0x0) || ((pVVar11->isReference & 1U) == 0)) {
          VVar8 = GetStoreInstruction((ExpressionContext *)module_local,(TypeBase *)address_local);
          pVVar11 = CreateConstantInt((Allocator *)
                                      module_local[6].loadStoreInfo.little[0xf].loadPointer,
                                      (SynBase *)type_local,0);
          type_00.structType._0_4_ = VVar8;
          type_00._0_8_ = pTVar5;
          type_00.structType._4_4_ = 0;
          ctx_local = (ExpressionContext *)
                      CreateInstruction((anon_unknown_dwarf_1a3010 *)pSVar12,(VmModule *)pTVar6,
                                        (SynBase *)uVar4,type_00,(VmInstructionType)pVVar9,
                                        &pVVar11->super_VmValue,local_40,in_stack_fffffffffffffeb8);
        }
        else {
          pVVar3 = module_local[6].loadStoreInfo.little[0xf].loadPointer;
          iVar1 = pVVar11->iValue;
          pVVar2 = pVVar11->container;
          pTVar10 = ExpressionContext::GetReferenceType
                              ((ExpressionContext *)module_local,(TypeBase *)address_local);
          pVVar11 = CreateConstantPointer
                              ((Allocator *)pVVar3,(SynBase *)pTVar6,iVar1,pVVar2,
                               &pTVar10->super_TypeBase,true);
          ctx_local = (ExpressionContext *)
                      CreateMemCopy((VmModule *)source_local,(SynBase *)type_local,
                                    &pVVar9->super_VmValue,0,&pVVar11->super_VmValue,0,
                                    (int)(address_local->comment).end);
        }
      }
    }
    return (VmValue *)ctx_local;
  }
  __assert_fail("value->type == GetVmType(ctx, type)",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x37f,
                "VmValue *(anonymous namespace)::CreateStore(ExpressionContext &, VmModule *, SynBase *, TypeBase *, VmValue *, VmValue *, unsigned int)"
               );
}

Assistant:

VmValue* CreateStore(ExpressionContext &ctx, VmModule *module, SynBase *source, TypeBase *type, VmValue *address, VmValue *value, unsigned offset)
	{
		assert(value->type == GetVmType(ctx, type));

		if(type->size == 0)
			return CreateVoid(module);

		if(VmConstant *constantAddress = getType<VmConstant>(address))
		{
			VmConstant *shiftAddress = CreateConstantPointer(module->allocator, source, constantAddress->iValue + offset, constantAddress->container, ctx.GetReferenceType(type), true);

			if(VmConstant *constant = getType<VmConstant>(value))
			{
				if(constant->isReference)
				{
					VmConstant *pointer = CreateConstantPointer(ctx.allocator, source, constant->iValue, constant->container, ctx.GetReferenceType(type), true);

					return CreateMemCopy(module, source, shiftAddress, 0, pointer, 0, int(type->size));
				}
			}

			return CreateInstruction(module, source, VmType::Void, GetStoreInstruction(ctx, type), shiftAddress, CreateConstantInt(ctx.allocator, source, 0), value);
		}

		if(VmConstant *constant = getType<VmConstant>(value))
		{
			if(constant->isReference)
			{
				VmConstant *pointer = CreateConstantPointer(ctx.allocator, source, constant->iValue, constant->container, ctx.GetReferenceType(type), true);

				return CreateMemCopy(module, source, address, offset, pointer, 0, int(type->size));
			}
		}

		return CreateInstruction(module, source, VmType::Void, GetStoreInstruction(ctx, type), address, CreateConstantInt(ctx.allocator, source, offset), value);
	}